

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t archive_read_disk_descend(archive *_a)

{
  long *plVar1;
  int iVar2;
  long in_RDI;
  wchar_t magic_test;
  int64_t unaff_retaddr;
  tree *t;
  archive_read_disk *a;
  tree *in_stack_00000020;
  char *in_stack_00000078;
  uint in_stack_00000080;
  uint in_stack_00000084;
  archive *in_stack_00000088;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  wchar_t wVar3;
  
  plVar1 = *(long **)(in_RDI + 0x78);
  iVar2 = __archive_check_magic
                    (in_stack_00000088,in_stack_00000084,in_stack_00000080,in_stack_00000078);
  if (iVar2 == -0x1e) {
    wVar3 = L'\xffffffe2';
  }
  else if ((*(int *)((long)plVar1 + 0x34) == 1) && ((int)plVar1[0x34] != 0)) {
    wVar3 = tree_current_is_physical_dir((tree *)CONCAT44(iVar2,in_stack_ffffffffffffffd8));
    if (wVar3 == L'\0') {
      wVar3 = tree_current_is_dir((tree *)CONCAT44(iVar2,in_stack_ffffffffffffffd8));
      if (wVar3 != L'\0') {
        tree_push(in_stack_00000020,(char *)_a,a._4_4_,(int64_t)t,unaff_retaddr,
                  (restore_time *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
        *(uint *)(*plVar1 + 0x48) = *(uint *)(*plVar1 + 0x48) | 2;
      }
    }
    else {
      tree_push(in_stack_00000020,(char *)_a,a._4_4_,(int64_t)t,unaff_retaddr,
                (restore_time *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      *(uint *)(*plVar1 + 0x48) = *(uint *)(*plVar1 + 0x48) | 1;
    }
    *(undefined4 *)(plVar1 + 0x34) = 0;
    wVar3 = L'\0';
  }
  else {
    wVar3 = L'\0';
  }
  return wVar3;
}

Assistant:

int
archive_read_disk_descend(struct archive *_a)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	struct tree *t = a->tree;

	archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC,
	    ARCHIVE_STATE_HEADER | ARCHIVE_STATE_DATA,
	    "archive_read_disk_descend");

	if (t->visit_type != TREE_REGULAR || !t->descend)
		return (ARCHIVE_OK);

	if (tree_current_is_physical_dir(t)) {
		tree_push(t, t->basename, t->current_filesystem_id,
		    t->lst.st_dev, t->lst.st_ino, &t->restore_time);
		t->stack->flags |= isDir;
	} else if (tree_current_is_dir(t)) {
		tree_push(t, t->basename, t->current_filesystem_id,
		    t->st.st_dev, t->st.st_ino, &t->restore_time);
		t->stack->flags |= isDirLink;
	}
	t->descend = 0;
	return (ARCHIVE_OK);
}